

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

tjhandle tjInitTransform(void)

{
  void *__s;
  char *__s_00;
  tjinstance *this_00;
  tjhandle handle;
  tjinstance *this;
  tjinstance *in_stack_fffffffffffffff8;
  tjhandle pvVar1;
  
  __s = malloc(0x6d8);
  if (__s == (void *)0x0) {
    __s_00 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(__s_00,200,"tjInitTransform(): Memory allocation failure");
    pvVar1 = (tjhandle)0x0;
  }
  else {
    memset(__s,0,0x6d8);
    snprintf((char *)((long)__s + 0x608),200,"No error");
    this_00 = (tjinstance *)_tjInitCompress(in_stack_fffffffffffffff8);
    if (this_00 == (tjinstance *)0x0) {
      pvVar1 = (tjhandle)0x0;
    }
    else {
      pvVar1 = _tjInitDecompress(this_00);
    }
  }
  return pvVar1;
}

Assistant:

DLLEXPORT tjhandle tjInitTransform(void)
{
  tjinstance *this = NULL;
  tjhandle handle = NULL;

  if ((this = (tjinstance *)malloc(sizeof(tjinstance))) == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjInitTransform(): Memory allocation failure");
    return NULL;
  }
  MEMZERO(this, sizeof(tjinstance));
  snprintf(this->errStr, JMSG_LENGTH_MAX, "No error");
  handle = _tjInitCompress(this);
  if (!handle) return NULL;
  handle = _tjInitDecompress(this);
  return handle;
}